

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O3

int ssl_parse_signature_algorithm
              (mbedtls_ssl_context *ssl,uchar **p,uchar *end,mbedtls_md_type_t *md_alg,
              mbedtls_pk_type_t *pk_alg)

{
  byte bVar1;
  mbedtls_md_type_t mVar2;
  mbedtls_pk_type_t mVar3;
  int iVar4;
  int line;
  char *format;
  
  iVar4 = 0;
  *md_alg = MBEDTLS_MD_NONE;
  *pk_alg = MBEDTLS_PK_NONE;
  if (ssl->minor_ver == 3) {
    iVar4 = -0x7b00;
    if (*p + 2 <= end) {
      mVar2 = mbedtls_ssl_md_alg_from_hash(**p);
      *md_alg = mVar2;
      if (mVar2 == MBEDTLS_MD_NONE) {
        bVar1 = **p;
        format = "Server used unsupported HashAlgorithm %d";
        line = 0x845;
      }
      else {
        mVar3 = mbedtls_ssl_pk_alg_from_sig((*p)[1]);
        *pk_alg = mVar3;
        if (mVar3 != MBEDTLS_PK_NONE) {
          iVar4 = mbedtls_ssl_check_sig_hash(ssl,*md_alg);
          if (iVar4 != 0) {
            mbedtls_debug_print_msg
                      (ssl,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                       ,0x859,"server used HashAlgorithm that was not offered");
            return -0x7b00;
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x85d,"Server used SignatureAlgorithm %d",(ulong)(*p)[1]);
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                     ,0x85e,"Server used HashAlgorithm %d",(ulong)**p);
          *p = *p + 2;
          return 0;
        }
        bVar1 = (*p)[1];
        format = "server used unsupported SignatureAlgorithm %d";
        line = 0x84f;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_cli.c"
                 ,line,format,(ulong)bVar1);
    }
  }
  return iVar4;
}

Assistant:

static int ssl_parse_signature_algorithm( mbedtls_ssl_context *ssl,
                                          unsigned char **p,
                                          unsigned char *end,
                                          mbedtls_md_type_t *md_alg,
                                          mbedtls_pk_type_t *pk_alg )
{
    ((void) ssl);
    *md_alg = MBEDTLS_MD_NONE;
    *pk_alg = MBEDTLS_PK_NONE;

    /* Only in TLS 1.2 */
    if( ssl->minor_ver != MBEDTLS_SSL_MINOR_VERSION_3 )
    {
        return( 0 );
    }

    if( (*p) + 2 > end )
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );

    /*
     * Get hash algorithm
     */
    if( ( *md_alg = mbedtls_ssl_md_alg_from_hash( (*p)[0] ) ) == MBEDTLS_MD_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "Server used unsupported "
                            "HashAlgorithm %d", *(p)[0] ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    /*
     * Get signature algorithm
     */
    if( ( *pk_alg = mbedtls_ssl_pk_alg_from_sig( (*p)[1] ) ) == MBEDTLS_PK_NONE )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server used unsupported "
                            "SignatureAlgorithm %d", (*p)[1] ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    /*
     * Check if the hash is acceptable
     */
    if( mbedtls_ssl_check_sig_hash( ssl, *md_alg ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "server used HashAlgorithm "
                                    "that was not offered" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_SERVER_KEY_EXCHANGE );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "Server used SignatureAlgorithm %d", (*p)[1] ) );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "Server used HashAlgorithm %d", (*p)[0] ) );
    *p += 2;

    return( 0 );
}